

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::AttachComments
          (LocationRecorder *this,string *leading,string *trailing,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *detached_comments)

{
  int iVar1;
  Location *pLVar2;
  ArenaImpl *this_00;
  uint uVar3;
  int iVar4;
  LogMessage *pLVar5;
  string *psVar6;
  Rep *pRVar7;
  Arena *pAVar8;
  string *psVar9;
  ulong uVar10;
  ArenaStringPtr *pAVar11;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar3 = (this->location_->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1ee);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_leading_comments(): ");
    internal::LogFinisher::operator=(&local_69,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
    uVar3 = (this->location_->_has_bits_).has_bits_[0];
  }
  if ((uVar3 & 2) != 0) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/parser.cc"
               ,0x1ef);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: !location_->has_trailing_comments(): ");
    internal::LogFinisher::operator=(&local_69,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if (leading->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 1;
    pAVar8 = (Arena *)(pLVar2->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    pAVar11 = &pLVar2->leading_comments_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
    }
    psVar9 = pAVar11->ptr_;
    if (psVar9 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar11,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar9 = pAVar11->ptr_;
    }
    std::__cxx11::string::swap((string *)psVar9);
  }
  if (trailing->_M_string_length != 0) {
    pLVar2 = this->location_;
    (pLVar2->_has_bits_).has_bits_[0] = (pLVar2->_has_bits_).has_bits_[0] | 2;
    pAVar8 = (Arena *)(pLVar2->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      .ptr_;
    pAVar11 = &pLVar2->trailing_comments_;
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18);
    }
    psVar9 = pAVar11->ptr_;
    if (psVar9 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstance
                (pAVar11,pAVar8,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      psVar9 = pAVar11->ptr_;
    }
    std::__cxx11::string::swap((string *)psVar9);
  }
  if ((detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (detached_comments->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    do {
      pLVar2 = this->location_;
      pRVar7 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar7 == (Rep *)0x0) {
        iVar4 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_;
LAB_0030f02c:
        internal::RepeatedPtrFieldBase::Reserve
                  (&(pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase,iVar4 + 1);
        pRVar7 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        iVar4 = pRVar7->allocated_size;
LAB_0030f03e:
        pRVar7->allocated_size = iVar4 + 1;
        this_00 = (ArenaImpl *)
                  (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.arena_;
        if (this_00 == (ArenaImpl *)0x0) {
          psVar6 = (string *)operator_new(0x20);
        }
        else {
          if (this_00[1].initial_block_ != (Block *)0x0) {
            Arena::OnArenaAllocation
                      ((Arena *)this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          }
          psVar6 = (string *)
                   internal::ArenaImpl::AllocateAlignedAndAddCleanup
                             (this_00,0x20,internal::arena_destruct_object<std::__cxx11::string>);
        }
        *(string **)psVar6 = psVar6 + 0x10;
        *(long *)(psVar6 + 8) = 0;
        psVar6[0x10] = (string)0x0;
        pRVar7 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.rep_;
        iVar4 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        pRVar7->elements[iVar4] = psVar6;
      }
      else {
        iVar1 = (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_;
        iVar4 = pRVar7->allocated_size;
        if (iVar4 <= iVar1) {
          if (iVar4 == (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.total_size_)
          goto LAB_0030f02c;
          goto LAB_0030f03e;
        }
        (pLVar2->leading_detached_comments_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        psVar6 = (string *)pRVar7->elements[iVar1];
      }
      std::__cxx11::string::swap(psVar6);
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)(detached_comments->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(detached_comments->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(detached_comments);
  return;
}

Assistant:

void Parser::LocationRecorder::AttachComments(
    std::string* leading, std::string* trailing,
    std::vector<std::string>* detached_comments) const {
  GOOGLE_CHECK(!location_->has_leading_comments());
  GOOGLE_CHECK(!location_->has_trailing_comments());

  if (!leading->empty()) {
    location_->mutable_leading_comments()->swap(*leading);
  }
  if (!trailing->empty()) {
    location_->mutable_trailing_comments()->swap(*trailing);
  }
  for (int i = 0; i < detached_comments->size(); ++i) {
    location_->add_leading_detached_comments()->swap((*detached_comments)[i]);
  }
  detached_comments->clear();
}